

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void ixmlNode_getElementsByTagNameNS
               (IXML_Node *n,char *namespaceURI,char *localName,IXML_NodeList **list)

{
  char *__s1;
  int iVar1;
  
  if (((n == (IXML_Node *)0x0) || (namespaceURI == (char *)0x0)) || (localName == (char *)0x0)) {
    __assert_fail("n != NULL && namespaceURI != NULL && localName != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                  0x53b,
                  "void ixmlNode_getElementsByTagNameNS(IXML_Node *, const char *, const char *, IXML_NodeList **)"
                 );
  }
  if ((short)n->nodeType == eELEMENT_NODE) {
    __s1 = n->localName;
    if (n->namespaceURI != (char *)0x0 && __s1 != (char *)0x0) {
      iVar1 = strcmp(namespaceURI,n->namespaceURI);
      if (iVar1 != 0) {
        iVar1 = strcmp(namespaceURI,"*");
        if (iVar1 != 0) goto LAB_0012909b;
      }
      iVar1 = strcmp(__s1,localName);
      if (iVar1 != 0) {
        iVar1 = strcmp(localName,"*");
        if (iVar1 != 0) goto LAB_0012909b;
      }
      ixmlNodeList_addToNodeList(list,n);
    }
  }
LAB_0012909b:
  ixmlNode_getElementsByTagNameNSRecursive(n->firstChild,namespaceURI,localName,list);
  return;
}

Assistant:

void ixmlNode_getElementsByTagNameNS(IXML_Node *n,
	const char *namespaceURI,
	const char *localName,
	IXML_NodeList **list)
{
	const DOMString nsURI;
	const DOMString name;

	assert(n != NULL && namespaceURI != NULL && localName != NULL);

	if (ixmlNode_getNodeType(n) == eELEMENT_NODE) {
		name = ixmlNode_getLocalName(n);
		nsURI = ixmlNode_getNamespaceURI(n);
		if (name != NULL && nsURI != NULL &&
			(strcmp(namespaceURI, nsURI) == 0 ||
				strcmp(namespaceURI, "*") == 0) &&
			(strcmp(name, localName) == 0 ||
				strcmp(localName, "*") == 0)) {
			ixmlNodeList_addToNodeList(list, n);
		}
	}

	ixmlNode_getElementsByTagNameNSRecursive(
		ixmlNode_getFirstChild(n), namespaceURI, localName, list);
}